

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_ep_match(ipc_ep *ep)

{
  nni_aio *aio;
  void *item;
  
  aio = ep->user_aio;
  if (aio != (nni_aio *)0x0) {
    item = nni_list_first(&ep->wait_pipes);
    if (item != (void *)0x0) {
      nni_list_remove(&ep->wait_pipes,item);
      ep->user_aio = (nni_aio *)0x0;
      *(size_t *)((long)item + 0x10) = ep->rcv_max;
      nni_aio_set_output(aio,0,*(void **)((long)item + 0x28));
      nni_aio_finish(aio,NNG_OK,0);
      return;
    }
  }
  return;
}

Assistant:

static void
ipc_ep_match(ipc_ep *ep)
{
	nni_aio  *aio;
	ipc_pipe *p;

	if (((aio = ep->user_aio) == NULL) ||
	    ((p = nni_list_first(&ep->wait_pipes)) == NULL)) {
		return;
	}
	nni_list_remove(&ep->wait_pipes, p);
	ep->user_aio = NULL;
	p->rcv_max   = ep->rcv_max;
	nni_aio_set_output(aio, 0, p->pipe);
	nni_aio_finish(aio, 0, 0);
}